

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.hpp
# Opt level: O2

enable_if_type<_std::is_void<result_type<_Mem_fn<bool_(Configuration::*)(const_basic_string<char>_&)>_&&(Configuration_*&&,_basic_string<char>_&)>_>::value,_std::pair<Mark,_result_type<_Mem_fn<bool_(Configuration::*)(const_basic_string<char>_&)>_&&(Configuration_*&&,_basic_string<char>_&)>_>_>
* __thiscall
bm::GenericBench<std::chrono::_V2::steady_clock>::
mark<std::_Mem_fn<bool(Configuration::*)(std::__cxx11::string_const&)>,Configuration*,std::__cxx11::string&>
          (enable_if_type<_std::is_void<result_type<_Mem_fn<bool_(Configuration::*)(const_basic_string<char>_&)>_&&(Configuration_*&&,_basic_string<char>_&)>_>::value,_std::pair<Mark,_result_type<_Mem_fn<bool_(Configuration::*)(const_basic_string<char>_&)>_&&(Configuration_*&&,_basic_string<char>_&)>_>_>
           *__return_storage_ptr__,GenericBench<std::chrono::_V2::steady_clock> *this,
          _Mem_fn<bool_(Configuration::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *func,Configuration **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  Mark mark;
  duration<long,_std::ratio<1L,_1000000000L>_> local_78;
  Mark local_70;
  
  lVar2 = std::chrono::_V2::steady_clock::now();
  bVar1 = std::
          __invoke_impl<bool,bool(Configuration::*const&)(std::__cxx11::string_const&),Configuration*,std::__cxx11::string&>
                    (this,func,args);
  lVar3 = std::chrono::_V2::steady_clock::now();
  local_78.__r = lVar3 - lVar2;
  Mark::Mark<long,std::ratio<1l,1000000000l>>(&local_70,&local_78);
  Mark::Mark(&__return_storage_ptr__->first,&local_70);
  __return_storage_ptr__->second = bVar1;
  std::_Function_base::~_Function_base(&local_70._overflow_callback.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

static auto mark(Func&& func, Args&&... args)
        -> enable_if_type< !std::is_void<result_type<Func&&(Args&&...)>>::value,
                           std::pair<Mark, result_type<Func&&(Args&&...)>> >
    {
        auto before = Clock::now();
        auto result = std::forward<Func>(func)(std::forward<Args>(args)...);
        auto after = Clock::now();
        auto mark = Mark(after - before);
        return std::make_pair(mark, result);
    }